

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  ushort uVar19;
  undefined1 auVar20 [15];
  ushort uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  unkuint9 Var34;
  undefined1 auVar35 [11];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  int iVar43;
  undefined1 (*pauVar44) [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar66 [16];
  short sVar67;
  short sVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  short sVar135;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined1 auVar136 [16];
  short sVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar88;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar114;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  byte bVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  byte bVar129;
  byte bVar133;
  byte bVar134;
  
  auVar144 = *(undefined1 (*) [16])above;
  auVar66 = *(undefined1 (*) [16])(above + 0x10);
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar144._0_13_;
  auVar17[0xe] = auVar144[7];
  uVar19 = auVar17._13_2_;
  auVar20[0xc] = auVar144[6];
  auVar20._0_12_ = auVar144._0_12_;
  auVar20._13_2_ = uVar19;
  auVar23[0xb] = 0;
  auVar23._0_11_ = auVar144._0_11_;
  auVar23._12_3_ = auVar20._12_3_;
  auVar25[10] = auVar144[5];
  auVar25._0_10_ = auVar144._0_10_;
  auVar25._11_4_ = auVar23._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar144._0_9_;
  auVar27._10_5_ = auVar25._10_5_;
  auVar29[8] = auVar144[4];
  auVar29._0_8_ = auVar144._0_8_;
  auVar29._9_6_ = auVar27._9_6_;
  auVar33._7_8_ = 0;
  auVar33._0_7_ = auVar29._8_7_;
  Var34 = CONCAT81(SUB158(auVar33 << 0x40,7),auVar144[3]);
  auVar39._9_6_ = 0;
  auVar39._0_9_ = Var34;
  auVar35._1_10_ = SUB1510(auVar39 << 0x30,5);
  auVar35[0] = auVar144[2];
  auVar40._11_4_ = 0;
  auVar40._0_11_ = auVar35;
  auVar31[2] = auVar144[1];
  auVar31._0_2_ = auVar144._0_2_;
  auVar31._3_12_ = SUB1512(auVar40 << 0x20,3);
  auVar89._0_2_ = auVar144._0_2_ & 0xff;
  auVar89._2_13_ = auVar31._2_13_;
  auVar89[0xf] = 0;
  auVar130._0_2_ = CONCAT11(0,auVar144[8]);
  bVar133 = auVar144[9];
  auVar130[2] = bVar133;
  auVar130[3] = 0;
  auVar130[4] = auVar144[10];
  auVar130[5] = 0;
  auVar130[6] = auVar144[0xb];
  auVar130[7] = 0;
  auVar130[8] = auVar144[0xc];
  auVar130[9] = 0;
  auVar130[10] = auVar144[0xd];
  auVar130[0xb] = 0;
  auVar130[0xc] = auVar144[0xe];
  auVar130[0xd] = 0;
  bVar134 = auVar144[0xf];
  auVar130[0xe] = bVar134;
  auVar130[0xf] = 0;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar66._0_13_;
  auVar18[0xe] = auVar66[7];
  uVar21 = auVar18._13_2_;
  auVar22[0xc] = auVar66[6];
  auVar22._0_12_ = auVar66._0_12_;
  auVar22._13_2_ = uVar21;
  auVar24[0xb] = 0;
  auVar24._0_11_ = auVar66._0_11_;
  auVar24._12_3_ = auVar22._12_3_;
  auVar26[10] = auVar66[5];
  auVar26._0_10_ = auVar66._0_10_;
  auVar26._11_4_ = auVar24._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar66._0_9_;
  auVar28._10_5_ = auVar26._10_5_;
  auVar30[8] = auVar66[4];
  auVar30._0_8_ = auVar66._0_8_;
  auVar30._9_6_ = auVar28._9_6_;
  auVar36._7_8_ = 0;
  auVar36._0_7_ = auVar30._8_7_;
  Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar66[3]);
  auVar41._9_6_ = 0;
  auVar41._0_9_ = Var37;
  auVar38._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar38[0] = auVar66[2];
  auVar42._11_4_ = 0;
  auVar42._0_11_ = auVar38;
  auVar32[2] = auVar66[1];
  auVar32._0_2_ = auVar66._0_2_;
  auVar32._3_12_ = SUB1512(auVar42 << 0x20,3);
  auVar58._0_2_ = auVar66._0_2_ & 0xff;
  auVar58._2_13_ = auVar32._2_13_;
  auVar58[0xf] = 0;
  auVar115._0_2_ = CONCAT11(0,auVar66[8]);
  bVar125 = auVar66[9];
  auVar115[2] = bVar125;
  auVar115[3] = 0;
  auVar115[4] = auVar66[10];
  auVar115[5] = 0;
  auVar115[6] = auVar66[0xb];
  auVar115[7] = 0;
  auVar115[8] = auVar66[0xc];
  auVar115[9] = 0;
  auVar115[10] = auVar66[0xd];
  auVar115[0xb] = 0;
  auVar115[0xc] = auVar66[0xe];
  auVar115[0xd] = 0;
  bVar129 = auVar66[0xf];
  auVar115[0xe] = bVar129;
  auVar115[0xf] = 0;
  auVar68 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar69._0_4_ = auVar68._0_4_;
  auVar69._4_4_ = auVar69._0_4_;
  auVar69._8_4_ = auVar69._0_4_;
  auVar69._12_4_ = auVar69._0_4_;
  auVar73 = *(undefined1 (*) [16])left;
  sVar67 = auVar68._0_2_;
  auVar71._0_2_ = auVar89._0_2_ - sVar67;
  sVar70 = auVar68._2_2_;
  sVar74 = auVar31._2_2_;
  auVar71._2_2_ = sVar74 - sVar70;
  sVar75 = auVar35._0_2_;
  auVar71._4_2_ = sVar75 - sVar67;
  sVar76 = (short)Var34;
  auVar71._6_2_ = sVar76 - sVar70;
  sVar77 = auVar29._8_2_;
  auVar71._8_2_ = sVar77 - sVar67;
  sVar78 = auVar25._10_2_;
  auVar71._10_2_ = sVar78 - sVar70;
  sVar79 = auVar20._12_2_;
  auVar71._12_2_ = sVar79 - sVar67;
  auVar71._14_2_ = (uVar19 >> 8) - sVar70;
  auVar68 = pabsw(auVar73,auVar71);
  auVar45._0_2_ = auVar130._0_2_ - sVar67;
  auVar45._2_2_ = (ushort)bVar133 - sVar70;
  uVar48 = (ushort)auVar144[10];
  auVar45._4_2_ = uVar48 - sVar67;
  uVar50 = (ushort)auVar144[0xb];
  auVar45._6_2_ = uVar50 - sVar70;
  uVar52 = (ushort)auVar144[0xc];
  auVar45._8_2_ = uVar52 - sVar67;
  uVar54 = (ushort)auVar144[0xd];
  auVar45._10_2_ = uVar54 - sVar70;
  uVar56 = (ushort)auVar144[0xe];
  auVar45._12_2_ = uVar56 - sVar67;
  auVar45._14_2_ = (ushort)bVar134 - sVar70;
  auVar46 = pabsw(auVar45,auVar45);
  auVar59._0_2_ = auVar58._0_2_ - sVar67;
  sVar60 = auVar32._2_2_;
  auVar59._2_2_ = sVar60 - sVar70;
  sVar61 = auVar38._0_2_;
  auVar59._4_2_ = sVar61 - sVar67;
  sVar62 = (short)Var37;
  auVar59._6_2_ = sVar62 - sVar70;
  sVar63 = auVar30._8_2_;
  auVar59._8_2_ = sVar63 - sVar67;
  sVar64 = auVar26._10_2_;
  auVar59._10_2_ = sVar64 - sVar70;
  sVar65 = auVar22._12_2_;
  auVar59._12_2_ = sVar65 - sVar67;
  auVar59._14_2_ = (uVar21 >> 8) - sVar70;
  auVar87 = pabsw(in_XMM7,auVar59);
  auVar47._0_2_ = auVar115._0_2_ - sVar67;
  auVar47._2_2_ = (ushort)bVar125 - sVar70;
  uVar49 = (ushort)auVar66[10];
  auVar47._4_2_ = uVar49 - sVar67;
  uVar51 = (ushort)auVar66[0xb];
  auVar47._6_2_ = uVar51 - sVar70;
  uVar53 = (ushort)auVar66[0xc];
  auVar47._8_2_ = uVar53 - sVar67;
  uVar55 = (ushort)auVar66[0xd];
  auVar47._10_2_ = uVar55 - sVar70;
  uVar57 = (ushort)auVar66[0xe];
  auVar47._12_2_ = uVar57 - sVar67;
  auVar47._14_2_ = (ushort)bVar129 - sVar70;
  auVar66 = pabsw(in_XMM2,auVar47);
  pauVar44 = (undefined1 (*) [16])(dst + 0x10);
  iVar43 = 0x10;
  auVar144 = _DAT_004d28e0;
  do {
    auVar136 = pshufb(auVar73,auVar144);
    sVar135 = auVar136._0_2_;
    sVar137 = auVar136._2_2_;
    sVar114 = auVar136._4_2_;
    sVar121 = auVar136._6_2_;
    sVar122 = auVar136._8_2_;
    sVar123 = auVar136._10_2_;
    sVar124 = auVar136._12_2_;
    sVar126 = auVar136._14_2_;
    auVar106._0_2_ = (auVar71._0_2_ + sVar135) - auVar89._0_2_;
    auVar106._2_2_ = (auVar71._2_2_ + sVar137) - sVar74;
    auVar106._4_2_ = (auVar71._4_2_ + sVar114) - sVar75;
    auVar106._6_2_ = (auVar71._6_2_ + sVar121) - sVar76;
    auVar106._8_2_ = (auVar71._8_2_ + sVar122) - sVar77;
    auVar106._10_2_ = (auVar71._10_2_ + sVar123) - sVar78;
    auVar106._12_2_ = (auVar71._12_2_ + sVar124) - sVar79;
    auVar106._14_2_ = (auVar71._14_2_ + sVar126) - (uVar19 >> 8);
    auVar107 = pabsw(auVar106,auVar106);
    auVar117._0_2_ = (auVar71._0_2_ + sVar135) - sVar67;
    auVar117._2_2_ = (auVar71._2_2_ + sVar137) - sVar70;
    auVar117._4_2_ = (auVar71._4_2_ + sVar114) - sVar67;
    auVar117._6_2_ = (auVar71._6_2_ + sVar121) - sVar70;
    auVar117._8_2_ = (auVar71._8_2_ + sVar122) - sVar67;
    auVar117._10_2_ = (auVar71._10_2_ + sVar123) - sVar70;
    auVar117._12_2_ = (auVar71._12_2_ + sVar124) - sVar67;
    auVar117._14_2_ = (auVar71._14_2_ + sVar126) - sVar70;
    auVar146 = pabsw(in_XMM15,auVar117);
    local_28 = auVar68._0_2_;
    sStack_26 = auVar68._2_2_;
    sStack_24 = auVar68._4_2_;
    sStack_22 = auVar68._6_2_;
    sStack_20 = auVar68._8_2_;
    sStack_1e = auVar68._10_2_;
    sStack_1c = auVar68._12_2_;
    sStack_1a = auVar68._14_2_;
    auVar72._0_2_ = -(ushort)(auVar107._0_2_ < local_28);
    auVar72._2_2_ = -(ushort)(auVar107._2_2_ < sStack_26);
    auVar72._4_2_ = -(ushort)(auVar107._4_2_ < sStack_24);
    auVar72._6_2_ = -(ushort)(auVar107._6_2_ < sStack_22);
    auVar72._8_2_ = -(ushort)(auVar107._8_2_ < sStack_20);
    auVar72._10_2_ = -(ushort)(auVar107._10_2_ < sStack_1e);
    auVar72._12_2_ = -(ushort)(auVar107._12_2_ < sStack_1c);
    auVar72._14_2_ = -(ushort)(auVar107._14_2_ < sStack_1a);
    auVar80._0_2_ = -(ushort)(auVar146._0_2_ < local_28);
    auVar80._2_2_ = -(ushort)(auVar146._2_2_ < sStack_26);
    auVar80._4_2_ = -(ushort)(auVar146._4_2_ < sStack_24);
    auVar80._6_2_ = -(ushort)(auVar146._6_2_ < sStack_22);
    auVar80._8_2_ = -(ushort)(auVar146._8_2_ < sStack_20);
    auVar80._10_2_ = -(ushort)(auVar146._10_2_ < sStack_1e);
    auVar80._12_2_ = -(ushort)(auVar146._12_2_ < sStack_1c);
    auVar80._14_2_ = -(ushort)(auVar146._14_2_ < sStack_1a);
    auVar108._0_2_ = -(ushort)(auVar146._0_2_ < auVar107._0_2_);
    auVar108._2_2_ = -(ushort)(auVar146._2_2_ < auVar107._2_2_);
    auVar108._4_2_ = -(ushort)(auVar146._4_2_ < auVar107._4_2_);
    auVar108._6_2_ = -(ushort)(auVar146._6_2_ < auVar107._6_2_);
    auVar108._8_2_ = -(ushort)(auVar146._8_2_ < auVar107._8_2_);
    auVar108._10_2_ = -(ushort)(auVar146._10_2_ < auVar107._10_2_);
    auVar108._12_2_ = -(ushort)(auVar146._12_2_ < auVar107._12_2_);
    auVar108._14_2_ = -(ushort)(auVar146._14_2_ < auVar107._14_2_);
    auVar147._0_2_ = (auVar45._0_2_ + sVar135) - auVar130._0_2_;
    auVar147._2_2_ = (auVar45._2_2_ + sVar137) - (ushort)bVar133;
    auVar147._4_2_ = (auVar45._4_2_ + sVar114) - uVar48;
    auVar147._6_2_ = (auVar45._6_2_ + sVar121) - uVar50;
    auVar147._8_2_ = (auVar45._8_2_ + sVar122) - uVar52;
    auVar147._10_2_ = (auVar45._10_2_ + sVar123) - uVar54;
    auVar147._12_2_ = (auVar45._12_2_ + sVar124) - uVar56;
    auVar147._14_2_ = (auVar45._14_2_ + sVar126) - (ushort)bVar134;
    auVar146 = pabsw(auVar147,auVar147);
    auVar107._0_2_ = (auVar45._0_2_ + sVar135) - sVar67;
    auVar107._2_2_ = (auVar45._2_2_ + sVar137) - sVar70;
    auVar107._4_2_ = (auVar45._4_2_ + sVar114) - sVar67;
    auVar107._6_2_ = (auVar45._6_2_ + sVar121) - sVar70;
    auVar107._8_2_ = (auVar45._8_2_ + sVar122) - sVar67;
    auVar107._10_2_ = (auVar45._10_2_ + sVar123) - sVar70;
    auVar107._12_2_ = (auVar45._12_2_ + sVar124) - sVar67;
    auVar107._14_2_ = (auVar45._14_2_ + sVar126) - sVar70;
    auVar107 = pabsw(auVar107,auVar107);
    local_48 = auVar46._0_2_;
    sStack_46 = auVar46._2_2_;
    sStack_44 = auVar46._4_2_;
    sStack_42 = auVar46._6_2_;
    sStack_40 = auVar46._8_2_;
    sStack_3e = auVar46._10_2_;
    sStack_3c = auVar46._12_2_;
    sStack_3a = auVar46._14_2_;
    auVar90._0_2_ = -(ushort)(auVar146._0_2_ < local_48);
    auVar90._2_2_ = -(ushort)(auVar146._2_2_ < sStack_46);
    auVar90._4_2_ = -(ushort)(auVar146._4_2_ < sStack_44);
    auVar90._6_2_ = -(ushort)(auVar146._6_2_ < sStack_42);
    auVar90._8_2_ = -(ushort)(auVar146._8_2_ < sStack_40);
    auVar90._10_2_ = -(ushort)(auVar146._10_2_ < sStack_3e);
    auVar90._12_2_ = -(ushort)(auVar146._12_2_ < sStack_3c);
    auVar90._14_2_ = -(ushort)(auVar146._14_2_ < sStack_3a);
    auVar116._0_2_ = -(ushort)(auVar107._0_2_ < local_48);
    auVar116._2_2_ = -(ushort)(auVar107._2_2_ < sStack_46);
    auVar116._4_2_ = -(ushort)(auVar107._4_2_ < sStack_44);
    auVar116._6_2_ = -(ushort)(auVar107._6_2_ < sStack_42);
    auVar116._8_2_ = -(ushort)(auVar107._8_2_ < sStack_40);
    auVar116._10_2_ = -(ushort)(auVar107._10_2_ < sStack_3e);
    auVar116._12_2_ = -(ushort)(auVar107._12_2_ < sStack_3c);
    auVar116._14_2_ = -(ushort)(auVar107._14_2_ < sStack_3a);
    auVar148._0_2_ = -(ushort)(auVar107._0_2_ < auVar146._0_2_);
    auVar148._2_2_ = -(ushort)(auVar107._2_2_ < auVar146._2_2_);
    auVar148._4_2_ = -(ushort)(auVar107._4_2_ < auVar146._4_2_);
    auVar148._6_2_ = -(ushort)(auVar107._6_2_ < auVar146._6_2_);
    auVar148._8_2_ = -(ushort)(auVar107._8_2_ < auVar146._8_2_);
    auVar148._10_2_ = -(ushort)(auVar107._10_2_ < auVar146._10_2_);
    auVar148._12_2_ = -(ushort)(auVar107._12_2_ < auVar146._12_2_);
    auVar148._14_2_ = -(ushort)(auVar107._14_2_ < auVar146._14_2_);
    auVar146 = (~auVar108 & auVar89 | auVar69 & auVar108) & (auVar80 | auVar72);
    auVar107 = ~(auVar80 | auVar72) & auVar136 | auVar146;
    auVar117 = ~(auVar116 | auVar90) & auVar136 |
               (~auVar148 & auVar130 | auVar69 & auVar148) & (auVar116 | auVar90);
    sVar1 = auVar107._0_2_;
    sVar2 = auVar107._2_2_;
    sVar3 = auVar107._4_2_;
    sVar4 = auVar107._6_2_;
    sVar5 = auVar107._8_2_;
    sVar6 = auVar107._10_2_;
    sVar7 = auVar107._12_2_;
    sVar8 = auVar107._14_2_;
    sVar9 = auVar117._0_2_;
    sVar10 = auVar117._2_2_;
    sVar11 = auVar117._4_2_;
    sVar12 = auVar117._6_2_;
    sVar13 = auVar117._8_2_;
    sVar14 = auVar117._10_2_;
    sVar15 = auVar117._12_2_;
    sVar16 = auVar117._14_2_;
    auVar91._0_2_ = (auVar59._0_2_ + sVar135) - auVar58._0_2_;
    auVar91._2_2_ = (auVar59._2_2_ + sVar137) - sVar60;
    auVar91._4_2_ = (auVar59._4_2_ + sVar114) - sVar61;
    auVar91._6_2_ = (auVar59._6_2_ + sVar121) - sVar62;
    auVar91._8_2_ = (auVar59._8_2_ + sVar122) - sVar63;
    auVar91._10_2_ = (auVar59._10_2_ + sVar123) - sVar64;
    auVar91._12_2_ = (auVar59._12_2_ + sVar124) - sVar65;
    auVar91._14_2_ = (auVar59._14_2_ + sVar126) - (uVar21 >> 8);
    auVar109 = pabsw(auVar146,auVar91);
    auVar146._0_2_ = (auVar59._0_2_ + sVar135) - sVar67;
    auVar146._2_2_ = (auVar59._2_2_ + sVar137) - sVar70;
    auVar146._4_2_ = (auVar59._4_2_ + sVar114) - sVar67;
    auVar146._6_2_ = (auVar59._6_2_ + sVar121) - sVar70;
    auVar146._8_2_ = (auVar59._8_2_ + sVar122) - sVar67;
    auVar146._10_2_ = (auVar59._10_2_ + sVar123) - sVar70;
    auVar146._12_2_ = (auVar59._12_2_ + sVar124) - sVar67;
    auVar146._14_2_ = (auVar59._14_2_ + sVar126) - sVar70;
    auVar72 = pabsw(auVar146,auVar146);
    sVar88 = auVar87._0_2_;
    auVar92._0_2_ = -(ushort)(auVar109._0_2_ < sVar88);
    sVar99 = auVar87._2_2_;
    auVar92._2_2_ = -(ushort)(auVar109._2_2_ < sVar99);
    sVar100 = auVar87._4_2_;
    auVar92._4_2_ = -(ushort)(auVar109._4_2_ < sVar100);
    sVar101 = auVar87._6_2_;
    auVar92._6_2_ = -(ushort)(auVar109._6_2_ < sVar101);
    sVar102 = auVar87._8_2_;
    auVar92._8_2_ = -(ushort)(auVar109._8_2_ < sVar102);
    sVar103 = auVar87._10_2_;
    auVar92._10_2_ = -(ushort)(auVar109._10_2_ < sVar103);
    sVar104 = auVar87._12_2_;
    sVar105 = auVar87._14_2_;
    auVar92._12_2_ = -(ushort)(auVar109._12_2_ < sVar104);
    auVar92._14_2_ = -(ushort)(auVar109._14_2_ < sVar105);
    auVar149._0_2_ = -(ushort)(auVar72._0_2_ < sVar88);
    auVar149._2_2_ = -(ushort)(auVar72._2_2_ < sVar99);
    auVar149._4_2_ = -(ushort)(auVar72._4_2_ < sVar100);
    auVar149._6_2_ = -(ushort)(auVar72._6_2_ < sVar101);
    auVar149._8_2_ = -(ushort)(auVar72._8_2_ < sVar102);
    auVar149._10_2_ = -(ushort)(auVar72._10_2_ < sVar103);
    auVar149._12_2_ = -(ushort)(auVar72._12_2_ < sVar104);
    auVar149._14_2_ = -(ushort)(auVar72._14_2_ < sVar105);
    auVar110._0_2_ = -(ushort)(auVar72._0_2_ < auVar109._0_2_);
    auVar110._2_2_ = -(ushort)(auVar72._2_2_ < auVar109._2_2_);
    auVar110._4_2_ = -(ushort)(auVar72._4_2_ < auVar109._4_2_);
    auVar110._6_2_ = -(ushort)(auVar72._6_2_ < auVar109._6_2_);
    auVar110._8_2_ = -(ushort)(auVar72._8_2_ < auVar109._8_2_);
    auVar110._10_2_ = -(ushort)(auVar72._10_2_ < auVar109._10_2_);
    auVar110._12_2_ = -(ushort)(auVar72._12_2_ < auVar109._12_2_);
    auVar110._14_2_ = -(ushort)(auVar72._14_2_ < auVar109._14_2_);
    auVar93._0_2_ = (auVar47._0_2_ + sVar135) - auVar115._0_2_;
    auVar93._2_2_ = (auVar47._2_2_ + sVar137) - (ushort)bVar125;
    auVar93._4_2_ = (auVar47._4_2_ + sVar114) - uVar49;
    auVar93._6_2_ = (auVar47._6_2_ + sVar121) - uVar51;
    auVar93._8_2_ = (auVar47._8_2_ + sVar122) - uVar53;
    auVar93._10_2_ = (auVar47._10_2_ + sVar123) - uVar55;
    auVar93._12_2_ = (auVar47._12_2_ + sVar124) - uVar57;
    auVar93._14_2_ = (auVar47._14_2_ + sVar126) - (ushort)bVar129;
    auVar146 = pabsw(auVar93,auVar93);
    auVar109._0_2_ = (auVar47._0_2_ + sVar135) - sVar67;
    auVar109._2_2_ = (auVar47._2_2_ + sVar137) - sVar70;
    auVar109._4_2_ = (auVar47._4_2_ + sVar114) - sVar67;
    auVar109._6_2_ = (auVar47._6_2_ + sVar121) - sVar70;
    auVar109._8_2_ = (auVar47._8_2_ + sVar122) - sVar67;
    auVar109._10_2_ = (auVar47._10_2_ + sVar123) - sVar70;
    auVar109._12_2_ = (auVar47._12_2_ + sVar124) - sVar67;
    auVar109._14_2_ = (auVar47._14_2_ + sVar126) - sVar70;
    auVar72 = pabsw(auVar109,auVar109);
    sVar114 = auVar66._0_2_;
    auVar118._0_2_ = -(ushort)(auVar146._0_2_ < sVar114);
    sVar121 = auVar66._2_2_;
    auVar118._2_2_ = -(ushort)(auVar146._2_2_ < sVar121);
    sVar122 = auVar66._4_2_;
    auVar118._4_2_ = -(ushort)(auVar146._4_2_ < sVar122);
    sVar123 = auVar66._6_2_;
    auVar118._6_2_ = -(ushort)(auVar146._6_2_ < sVar123);
    sVar124 = auVar66._8_2_;
    auVar118._8_2_ = -(ushort)(auVar146._8_2_ < sVar124);
    sVar126 = auVar66._10_2_;
    auVar118._10_2_ = -(ushort)(auVar146._10_2_ < sVar126);
    sVar127 = auVar66._12_2_;
    sVar128 = auVar66._14_2_;
    auVar118._12_2_ = -(ushort)(auVar146._12_2_ < sVar127);
    auVar118._14_2_ = -(ushort)(auVar146._14_2_ < sVar128);
    auVar131._0_2_ = -(ushort)(auVar72._0_2_ < sVar114);
    auVar131._2_2_ = -(ushort)(auVar72._2_2_ < sVar121);
    auVar131._4_2_ = -(ushort)(auVar72._4_2_ < sVar122);
    auVar131._6_2_ = -(ushort)(auVar72._6_2_ < sVar123);
    auVar131._8_2_ = -(ushort)(auVar72._8_2_ < sVar124);
    auVar131._10_2_ = -(ushort)(auVar72._10_2_ < sVar126);
    auVar131._12_2_ = -(ushort)(auVar72._12_2_ < sVar127);
    auVar131._14_2_ = -(ushort)(auVar72._14_2_ < sVar128);
    auVar94._0_2_ = -(ushort)(auVar72._0_2_ < auVar146._0_2_);
    auVar94._2_2_ = -(ushort)(auVar72._2_2_ < auVar146._2_2_);
    auVar94._4_2_ = -(ushort)(auVar72._4_2_ < auVar146._4_2_);
    auVar94._6_2_ = -(ushort)(auVar72._6_2_ < auVar146._6_2_);
    auVar94._8_2_ = -(ushort)(auVar72._8_2_ < auVar146._8_2_);
    auVar94._10_2_ = -(ushort)(auVar72._10_2_ < auVar146._10_2_);
    auVar94._12_2_ = -(ushort)(auVar72._12_2_ < auVar146._12_2_);
    auVar94._14_2_ = -(ushort)(auVar72._14_2_ < auVar146._14_2_);
    auVar111 = (~auVar110 & auVar58 | auVar69 & auVar110) & (auVar149 | auVar92);
    auVar146 = ~(auVar149 | auVar92) & auVar136 | auVar111;
    auVar72 = ~(auVar131 | auVar118) & auVar136 |
              (~auVar94 & auVar115 | auVar69 & auVar94) & (auVar131 | auVar118);
    sVar135 = auVar146._0_2_;
    sVar137 = auVar146._2_2_;
    in_XMM15[1] = (0 < sVar137) * (sVar137 < 0x100) * auVar146[2] - (0xff < sVar137);
    in_XMM15[0] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[0] - (0xff < sVar135);
    sVar135 = auVar146._4_2_;
    in_XMM15[2] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[4] - (0xff < sVar135);
    sVar135 = auVar146._6_2_;
    in_XMM15[3] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[6] - (0xff < sVar135);
    sVar135 = auVar146._8_2_;
    in_XMM15[4] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[8] - (0xff < sVar135);
    sVar135 = auVar146._10_2_;
    in_XMM15[5] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[10] - (0xff < sVar135);
    sVar135 = auVar146._12_2_;
    in_XMM15[6] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[0xc] - (0xff < sVar135);
    sVar135 = auVar146._14_2_;
    in_XMM15[7] = (0 < sVar135) * (sVar135 < 0x100) * auVar146[0xe] - (0xff < sVar135);
    sVar135 = auVar72._0_2_;
    in_XMM15[8] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[0] - (0xff < sVar135);
    sVar135 = auVar72._2_2_;
    in_XMM15[9] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[2] - (0xff < sVar135);
    sVar135 = auVar72._4_2_;
    in_XMM15[10] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[4] - (0xff < sVar135);
    sVar135 = auVar72._6_2_;
    in_XMM15[0xb] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[6] - (0xff < sVar135);
    sVar135 = auVar72._8_2_;
    in_XMM15[0xc] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[8] - (0xff < sVar135);
    sVar135 = auVar72._10_2_;
    in_XMM15[0xd] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[10] - (0xff < sVar135);
    sVar135 = auVar72._12_2_;
    in_XMM15[0xe] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[0xc] - (0xff < sVar135);
    sVar135 = auVar72._14_2_;
    in_XMM15[0xf] = (0 < sVar135) * (sVar135 < 0x100) * auVar72[0xe] - (0xff < sVar135);
    pauVar44[-1][0] = (0 < sVar1) * (sVar1 < 0x100) * auVar107[0] - (0xff < sVar1);
    pauVar44[-1][1] = (0 < sVar2) * (sVar2 < 0x100) * auVar107[2] - (0xff < sVar2);
    pauVar44[-1][2] = (0 < sVar3) * (sVar3 < 0x100) * auVar107[4] - (0xff < sVar3);
    pauVar44[-1][3] = (0 < sVar4) * (sVar4 < 0x100) * auVar107[6] - (0xff < sVar4);
    pauVar44[-1][4] = (0 < sVar5) * (sVar5 < 0x100) * auVar107[8] - (0xff < sVar5);
    pauVar44[-1][5] = (0 < sVar6) * (sVar6 < 0x100) * auVar107[10] - (0xff < sVar6);
    pauVar44[-1][6] = (0 < sVar7) * (sVar7 < 0x100) * auVar107[0xc] - (0xff < sVar7);
    pauVar44[-1][7] = (0 < sVar8) * (sVar8 < 0x100) * auVar107[0xe] - (0xff < sVar8);
    pauVar44[-1][8] = (0 < sVar9) * (sVar9 < 0x100) * auVar117[0] - (0xff < sVar9);
    pauVar44[-1][9] = (0 < sVar10) * (sVar10 < 0x100) * auVar117[2] - (0xff < sVar10);
    pauVar44[-1][10] = (0 < sVar11) * (sVar11 < 0x100) * auVar117[4] - (0xff < sVar11);
    pauVar44[-1][0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar117[6] - (0xff < sVar12);
    pauVar44[-1][0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar117[8] - (0xff < sVar13);
    pauVar44[-1][0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar117[10] - (0xff < sVar14);
    pauVar44[-1][0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar117[0xc] - (0xff < sVar15);
    pauVar44[-1][0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar117[0xe] - (0xff < sVar16);
    *pauVar44 = in_XMM15;
    auVar136._0_2_ = auVar144._0_2_ + 1;
    auVar136._2_2_ = auVar144._2_2_ + 1;
    auVar136._4_2_ = auVar144._4_2_ + 1;
    auVar136._6_2_ = auVar144._6_2_ + 1;
    auVar136._8_2_ = auVar144._8_2_ + 1;
    auVar136._10_2_ = auVar144._10_2_ + 1;
    auVar136._12_2_ = auVar144._12_2_ + 1;
    auVar136._14_2_ = auVar144._14_2_ + 1;
    pauVar44 = (undefined1 (*) [16])(*pauVar44 + stride);
    iVar43 = iVar43 + -1;
    auVar144 = auVar136;
  } while (iVar43 != 0);
  auVar144 = *(undefined1 (*) [16])(left + 0x10);
  iVar43 = 0x10;
  auVar66 = _DAT_004d28e0;
  do {
    auVar107 = pshufb(auVar144,auVar66);
    sVar135 = auVar107._0_2_;
    sVar137 = auVar107._2_2_;
    sVar138 = auVar107._4_2_;
    sVar139 = auVar107._6_2_;
    sVar140 = auVar107._8_2_;
    sVar141 = auVar107._10_2_;
    sVar142 = auVar107._12_2_;
    sVar143 = auVar107._14_2_;
    auVar81._0_2_ = (auVar71._0_2_ + sVar135) - auVar89._0_2_;
    auVar81._2_2_ = (auVar71._2_2_ + sVar137) - sVar74;
    auVar81._4_2_ = (auVar71._4_2_ + sVar138) - sVar75;
    auVar81._6_2_ = (auVar71._6_2_ + sVar139) - sVar76;
    auVar81._8_2_ = (auVar71._8_2_ + sVar140) - sVar77;
    auVar81._10_2_ = (auVar71._10_2_ + sVar141) - sVar78;
    auVar81._12_2_ = (auVar71._12_2_ + sVar142) - sVar79;
    auVar81._14_2_ = (auVar71._14_2_ + sVar143) - (uVar19 >> 8);
    auVar68 = pabsw(auVar111,auVar81);
    auVar73._0_2_ = (auVar71._0_2_ + sVar135) - sVar67;
    auVar73._2_2_ = (auVar71._2_2_ + sVar137) - sVar70;
    auVar73._4_2_ = (auVar71._4_2_ + sVar138) - sVar67;
    auVar73._6_2_ = (auVar71._6_2_ + sVar139) - sVar70;
    auVar73._8_2_ = (auVar71._8_2_ + sVar140) - sVar67;
    auVar73._10_2_ = (auVar71._10_2_ + sVar141) - sVar70;
    auVar73._12_2_ = (auVar71._12_2_ + sVar142) - sVar67;
    auVar73._14_2_ = (auVar71._14_2_ + sVar143) - sVar70;
    auVar73 = pabsw(auVar73,auVar73);
    auVar82._0_2_ = -(ushort)(auVar68._0_2_ < local_28);
    auVar82._2_2_ = -(ushort)(auVar68._2_2_ < sStack_26);
    auVar82._4_2_ = -(ushort)(auVar68._4_2_ < sStack_24);
    auVar82._6_2_ = -(ushort)(auVar68._6_2_ < sStack_22);
    auVar82._8_2_ = -(ushort)(auVar68._8_2_ < sStack_20);
    auVar82._10_2_ = -(ushort)(auVar68._10_2_ < sStack_1e);
    auVar82._12_2_ = -(ushort)(auVar68._12_2_ < sStack_1c);
    auVar82._14_2_ = -(ushort)(auVar68._14_2_ < sStack_1a);
    auVar150._0_2_ = -(ushort)(auVar73._0_2_ < local_28);
    auVar150._2_2_ = -(ushort)(auVar73._2_2_ < sStack_26);
    auVar150._4_2_ = -(ushort)(auVar73._4_2_ < sStack_24);
    auVar150._6_2_ = -(ushort)(auVar73._6_2_ < sStack_22);
    auVar150._8_2_ = -(ushort)(auVar73._8_2_ < sStack_20);
    auVar150._10_2_ = -(ushort)(auVar73._10_2_ < sStack_1e);
    auVar150._12_2_ = -(ushort)(auVar73._12_2_ < sStack_1c);
    auVar150._14_2_ = -(ushort)(auVar73._14_2_ < sStack_1a);
    auVar112._0_2_ = -(ushort)(auVar73._0_2_ < auVar68._0_2_);
    auVar112._2_2_ = -(ushort)(auVar73._2_2_ < auVar68._2_2_);
    auVar112._4_2_ = -(ushort)(auVar73._4_2_ < auVar68._4_2_);
    auVar112._6_2_ = -(ushort)(auVar73._6_2_ < auVar68._6_2_);
    auVar112._8_2_ = -(ushort)(auVar73._8_2_ < auVar68._8_2_);
    auVar112._10_2_ = -(ushort)(auVar73._10_2_ < auVar68._10_2_);
    auVar112._12_2_ = -(ushort)(auVar73._12_2_ < auVar68._12_2_);
    auVar112._14_2_ = -(ushort)(auVar73._14_2_ < auVar68._14_2_);
    auVar83._0_2_ = (auVar45._0_2_ + sVar135) - auVar130._0_2_;
    auVar83._2_2_ = (auVar45._2_2_ + sVar137) - (ushort)bVar133;
    auVar83._4_2_ = (auVar45._4_2_ + sVar138) - uVar48;
    auVar83._6_2_ = (auVar45._6_2_ + sVar139) - uVar50;
    auVar83._8_2_ = (auVar45._8_2_ + sVar140) - uVar52;
    auVar83._10_2_ = (auVar45._10_2_ + sVar141) - uVar54;
    auVar83._12_2_ = (auVar45._12_2_ + sVar142) - uVar56;
    auVar83._14_2_ = (auVar45._14_2_ + sVar143) - (ushort)bVar134;
    auVar46 = pabsw(auVar83,auVar83);
    auVar68._0_2_ = (auVar45._0_2_ + sVar135) - sVar67;
    auVar68._2_2_ = (auVar45._2_2_ + sVar137) - sVar70;
    auVar68._4_2_ = (auVar45._4_2_ + sVar138) - sVar67;
    auVar68._6_2_ = (auVar45._6_2_ + sVar139) - sVar70;
    auVar68._8_2_ = (auVar45._8_2_ + sVar140) - sVar67;
    auVar68._10_2_ = (auVar45._10_2_ + sVar141) - sVar70;
    auVar68._12_2_ = (auVar45._12_2_ + sVar142) - sVar67;
    auVar68._14_2_ = (auVar45._14_2_ + sVar143) - sVar70;
    auVar73 = pabsw(auVar68,auVar68);
    auVar95._0_2_ = -(ushort)(auVar46._0_2_ < local_48);
    auVar95._2_2_ = -(ushort)(auVar46._2_2_ < sStack_46);
    auVar95._4_2_ = -(ushort)(auVar46._4_2_ < sStack_44);
    auVar95._6_2_ = -(ushort)(auVar46._6_2_ < sStack_42);
    auVar95._8_2_ = -(ushort)(auVar46._8_2_ < sStack_40);
    auVar95._10_2_ = -(ushort)(auVar46._10_2_ < sStack_3e);
    auVar95._12_2_ = -(ushort)(auVar46._12_2_ < sStack_3c);
    auVar95._14_2_ = -(ushort)(auVar46._14_2_ < sStack_3a);
    auVar119._0_2_ = -(ushort)(auVar73._0_2_ < local_48);
    auVar119._2_2_ = -(ushort)(auVar73._2_2_ < sStack_46);
    auVar119._4_2_ = -(ushort)(auVar73._4_2_ < sStack_44);
    auVar119._6_2_ = -(ushort)(auVar73._6_2_ < sStack_42);
    auVar119._8_2_ = -(ushort)(auVar73._8_2_ < sStack_40);
    auVar119._10_2_ = -(ushort)(auVar73._10_2_ < sStack_3e);
    auVar119._12_2_ = -(ushort)(auVar73._12_2_ < sStack_3c);
    auVar119._14_2_ = -(ushort)(auVar73._14_2_ < sStack_3a);
    auVar84._0_2_ = -(ushort)(auVar73._0_2_ < auVar46._0_2_);
    auVar84._2_2_ = -(ushort)(auVar73._2_2_ < auVar46._2_2_);
    auVar84._4_2_ = -(ushort)(auVar73._4_2_ < auVar46._4_2_);
    auVar84._6_2_ = -(ushort)(auVar73._6_2_ < auVar46._6_2_);
    auVar84._8_2_ = -(ushort)(auVar73._8_2_ < auVar46._8_2_);
    auVar84._10_2_ = -(ushort)(auVar73._10_2_ < auVar46._10_2_);
    auVar84._12_2_ = -(ushort)(auVar73._12_2_ < auVar46._12_2_);
    auVar84._14_2_ = -(ushort)(auVar73._14_2_ < auVar46._14_2_);
    auVar146 = ~(auVar150 | auVar82) & auVar107 |
               (~auVar112 & auVar89 | auVar69 & auVar112) & (auVar150 | auVar82);
    auVar72 = ~(auVar119 | auVar95) & auVar107 |
              (~auVar84 & auVar130 | auVar69 & auVar84) & (auVar119 | auVar95);
    sVar1 = auVar146._0_2_;
    sVar2 = auVar146._2_2_;
    sVar3 = auVar146._4_2_;
    sVar4 = auVar146._6_2_;
    sVar5 = auVar146._8_2_;
    sVar6 = auVar146._10_2_;
    sVar7 = auVar146._12_2_;
    sVar8 = auVar146._14_2_;
    sVar9 = auVar72._0_2_;
    sVar10 = auVar72._2_2_;
    sVar11 = auVar72._4_2_;
    sVar12 = auVar72._6_2_;
    sVar13 = auVar72._8_2_;
    sVar14 = auVar72._10_2_;
    sVar15 = auVar72._12_2_;
    sVar16 = auVar72._14_2_;
    auVar85._0_2_ = (auVar59._0_2_ + sVar135) - auVar58._0_2_;
    auVar85._2_2_ = (auVar59._2_2_ + sVar137) - sVar60;
    auVar85._4_2_ = (auVar59._4_2_ + sVar138) - sVar61;
    auVar85._6_2_ = (auVar59._6_2_ + sVar139) - sVar62;
    auVar85._8_2_ = (auVar59._8_2_ + sVar140) - sVar63;
    auVar85._10_2_ = (auVar59._10_2_ + sVar141) - sVar64;
    auVar85._12_2_ = (auVar59._12_2_ + sVar142) - sVar65;
    auVar85._14_2_ = (auVar59._14_2_ + sVar143) - (uVar21 >> 8);
    auVar68 = pabsw(auVar85,auVar85);
    auVar46._0_2_ = (auVar59._0_2_ + sVar135) - sVar67;
    auVar46._2_2_ = (auVar59._2_2_ + sVar137) - sVar70;
    auVar46._4_2_ = (auVar59._4_2_ + sVar138) - sVar67;
    auVar46._6_2_ = (auVar59._6_2_ + sVar139) - sVar70;
    auVar46._8_2_ = (auVar59._8_2_ + sVar140) - sVar67;
    auVar46._10_2_ = (auVar59._10_2_ + sVar141) - sVar70;
    auVar46._12_2_ = (auVar59._12_2_ + sVar142) - sVar67;
    auVar46._14_2_ = (auVar59._14_2_ + sVar143) - sVar70;
    auVar73 = pabsw(auVar46,auVar46);
    auVar96._0_2_ = -(ushort)(auVar68._0_2_ < sVar88);
    auVar96._2_2_ = -(ushort)(auVar68._2_2_ < sVar99);
    auVar96._4_2_ = -(ushort)(auVar68._4_2_ < sVar100);
    auVar96._6_2_ = -(ushort)(auVar68._6_2_ < sVar101);
    auVar96._8_2_ = -(ushort)(auVar68._8_2_ < sVar102);
    auVar96._10_2_ = -(ushort)(auVar68._10_2_ < sVar103);
    auVar96._12_2_ = -(ushort)(auVar68._12_2_ < sVar104);
    auVar96._14_2_ = -(ushort)(auVar68._14_2_ < sVar105);
    auVar113._0_2_ = -(ushort)(auVar73._0_2_ < sVar88);
    auVar113._2_2_ = -(ushort)(auVar73._2_2_ < sVar99);
    auVar113._4_2_ = -(ushort)(auVar73._4_2_ < sVar100);
    auVar113._6_2_ = -(ushort)(auVar73._6_2_ < sVar101);
    auVar113._8_2_ = -(ushort)(auVar73._8_2_ < sVar102);
    auVar113._10_2_ = -(ushort)(auVar73._10_2_ < sVar103);
    auVar113._12_2_ = -(ushort)(auVar73._12_2_ < sVar104);
    auVar113._14_2_ = -(ushort)(auVar73._14_2_ < sVar105);
    auVar86._0_2_ = -(ushort)(auVar73._0_2_ < auVar68._0_2_);
    auVar86._2_2_ = -(ushort)(auVar73._2_2_ < auVar68._2_2_);
    auVar86._4_2_ = -(ushort)(auVar73._4_2_ < auVar68._4_2_);
    auVar86._6_2_ = -(ushort)(auVar73._6_2_ < auVar68._6_2_);
    auVar86._8_2_ = -(ushort)(auVar73._8_2_ < auVar68._8_2_);
    auVar86._10_2_ = -(ushort)(auVar73._10_2_ < auVar68._10_2_);
    auVar86._12_2_ = -(ushort)(auVar73._12_2_ < auVar68._12_2_);
    auVar86._14_2_ = -(ushort)(auVar73._14_2_ < auVar68._14_2_);
    auVar97._0_2_ = (auVar47._0_2_ + sVar135) - auVar115._0_2_;
    auVar97._2_2_ = (auVar47._2_2_ + sVar137) - (ushort)bVar125;
    auVar97._4_2_ = (auVar47._4_2_ + sVar138) - uVar49;
    auVar97._6_2_ = (auVar47._6_2_ + sVar139) - uVar51;
    auVar97._8_2_ = (auVar47._8_2_ + sVar140) - uVar53;
    auVar97._10_2_ = (auVar47._10_2_ + sVar141) - uVar55;
    auVar97._12_2_ = (auVar47._12_2_ + sVar142) - uVar57;
    auVar97._14_2_ = (auVar47._14_2_ + sVar143) - (ushort)bVar129;
    auVar68 = pabsw(auVar97,auVar97);
    auVar87._0_2_ = (auVar47._0_2_ + sVar135) - sVar67;
    auVar87._2_2_ = (auVar47._2_2_ + sVar137) - sVar70;
    auVar87._4_2_ = (auVar47._4_2_ + sVar138) - sVar67;
    auVar87._6_2_ = (auVar47._6_2_ + sVar139) - sVar70;
    auVar87._8_2_ = (auVar47._8_2_ + sVar140) - sVar67;
    auVar87._10_2_ = (auVar47._10_2_ + sVar141) - sVar70;
    auVar87._12_2_ = (auVar47._12_2_ + sVar142) - sVar67;
    auVar87._14_2_ = (auVar47._14_2_ + sVar143) - sVar70;
    auVar73 = pabsw(auVar87,auVar87);
    auVar120._0_2_ = -(ushort)(auVar68._0_2_ < sVar114);
    auVar120._2_2_ = -(ushort)(auVar68._2_2_ < sVar121);
    auVar120._4_2_ = -(ushort)(auVar68._4_2_ < sVar122);
    auVar120._6_2_ = -(ushort)(auVar68._6_2_ < sVar123);
    auVar120._8_2_ = -(ushort)(auVar68._8_2_ < sVar124);
    auVar120._10_2_ = -(ushort)(auVar68._10_2_ < sVar126);
    auVar120._12_2_ = -(ushort)(auVar68._12_2_ < sVar127);
    auVar120._14_2_ = -(ushort)(auVar68._14_2_ < sVar128);
    auVar132._0_2_ = -(ushort)(auVar73._0_2_ < sVar114);
    auVar132._2_2_ = -(ushort)(auVar73._2_2_ < sVar121);
    auVar132._4_2_ = -(ushort)(auVar73._4_2_ < sVar122);
    auVar132._6_2_ = -(ushort)(auVar73._6_2_ < sVar123);
    auVar132._8_2_ = -(ushort)(auVar73._8_2_ < sVar124);
    auVar132._10_2_ = -(ushort)(auVar73._10_2_ < sVar126);
    auVar132._12_2_ = -(ushort)(auVar73._12_2_ < sVar127);
    auVar132._14_2_ = -(ushort)(auVar73._14_2_ < sVar128);
    auVar98._0_2_ = -(ushort)(auVar73._0_2_ < auVar68._0_2_);
    auVar98._2_2_ = -(ushort)(auVar73._2_2_ < auVar68._2_2_);
    auVar98._4_2_ = -(ushort)(auVar73._4_2_ < auVar68._4_2_);
    auVar98._6_2_ = -(ushort)(auVar73._6_2_ < auVar68._6_2_);
    auVar98._8_2_ = -(ushort)(auVar73._8_2_ < auVar68._8_2_);
    auVar98._10_2_ = -(ushort)(auVar73._10_2_ < auVar68._10_2_);
    auVar98._12_2_ = -(ushort)(auVar73._12_2_ < auVar68._12_2_);
    auVar98._14_2_ = -(ushort)(auVar73._14_2_ < auVar68._14_2_);
    auVar73 = ~(auVar113 | auVar96) & auVar107 |
              (~auVar86 & auVar58 | auVar69 & auVar86) & (auVar113 | auVar96);
    auVar68 = ~(auVar132 | auVar120) & auVar107 |
              (~auVar98 & auVar115 | auVar69 & auVar98) & (auVar132 | auVar120);
    sVar135 = auVar73._0_2_;
    sVar137 = auVar73._2_2_;
    auVar111[1] = (0 < sVar137) * (sVar137 < 0x100) * auVar73[2] - (0xff < sVar137);
    auVar111[0] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[0] - (0xff < sVar135);
    sVar135 = auVar73._4_2_;
    auVar111[2] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[4] - (0xff < sVar135);
    sVar135 = auVar73._6_2_;
    auVar111[3] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[6] - (0xff < sVar135);
    sVar135 = auVar73._8_2_;
    auVar111[4] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[8] - (0xff < sVar135);
    sVar135 = auVar73._10_2_;
    auVar111[5] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[10] - (0xff < sVar135);
    sVar135 = auVar73._12_2_;
    auVar111[6] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[0xc] - (0xff < sVar135);
    sVar135 = auVar73._14_2_;
    auVar111[7] = (0 < sVar135) * (sVar135 < 0x100) * auVar73[0xe] - (0xff < sVar135);
    sVar135 = auVar68._0_2_;
    auVar111[8] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[0] - (0xff < sVar135);
    sVar135 = auVar68._2_2_;
    auVar111[9] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[2] - (0xff < sVar135);
    sVar135 = auVar68._4_2_;
    auVar111[10] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[4] - (0xff < sVar135);
    sVar135 = auVar68._6_2_;
    auVar111[0xb] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[6] - (0xff < sVar135);
    sVar135 = auVar68._8_2_;
    auVar111[0xc] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[8] - (0xff < sVar135);
    sVar135 = auVar68._10_2_;
    auVar111[0xd] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[10] - (0xff < sVar135);
    sVar135 = auVar68._12_2_;
    auVar111[0xe] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[0xc] - (0xff < sVar135);
    sVar135 = auVar68._14_2_;
    auVar111[0xf] = (0 < sVar135) * (sVar135 < 0x100) * auVar68[0xe] - (0xff < sVar135);
    pauVar44[-1][0] = (0 < sVar1) * (sVar1 < 0x100) * auVar146[0] - (0xff < sVar1);
    pauVar44[-1][1] = (0 < sVar2) * (sVar2 < 0x100) * auVar146[2] - (0xff < sVar2);
    pauVar44[-1][2] = (0 < sVar3) * (sVar3 < 0x100) * auVar146[4] - (0xff < sVar3);
    pauVar44[-1][3] = (0 < sVar4) * (sVar4 < 0x100) * auVar146[6] - (0xff < sVar4);
    pauVar44[-1][4] = (0 < sVar5) * (sVar5 < 0x100) * auVar146[8] - (0xff < sVar5);
    pauVar44[-1][5] = (0 < sVar6) * (sVar6 < 0x100) * auVar146[10] - (0xff < sVar6);
    pauVar44[-1][6] = (0 < sVar7) * (sVar7 < 0x100) * auVar146[0xc] - (0xff < sVar7);
    pauVar44[-1][7] = (0 < sVar8) * (sVar8 < 0x100) * auVar146[0xe] - (0xff < sVar8);
    pauVar44[-1][8] = (0 < sVar9) * (sVar9 < 0x100) * auVar72[0] - (0xff < sVar9);
    pauVar44[-1][9] = (0 < sVar10) * (sVar10 < 0x100) * auVar72[2] - (0xff < sVar10);
    pauVar44[-1][10] = (0 < sVar11) * (sVar11 < 0x100) * auVar72[4] - (0xff < sVar11);
    pauVar44[-1][0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar72[6] - (0xff < sVar12);
    pauVar44[-1][0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar72[8] - (0xff < sVar13);
    pauVar44[-1][0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar72[10] - (0xff < sVar14);
    pauVar44[-1][0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar72[0xc] - (0xff < sVar15);
    pauVar44[-1][0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar72[0xe] - (0xff < sVar16);
    *pauVar44 = auVar111;
    auVar145._0_2_ = auVar66._0_2_ + 1;
    auVar145._2_2_ = auVar66._2_2_ + 1;
    auVar145._4_2_ = auVar66._4_2_ + 1;
    auVar145._6_2_ = auVar66._6_2_ + 1;
    auVar145._8_2_ = auVar66._8_2_ + 1;
    auVar145._10_2_ = auVar66._10_2_ + 1;
    auVar145._12_2_ = auVar66._12_2_ + 1;
    auVar145._14_2_ = auVar66._14_2_ + 1;
    pauVar44 = (undefined1 (*) [16])(*pauVar44 + stride);
    iVar43 = iVar43 + -1;
    auVar66 = auVar145;
  } while (iVar43 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  rep = _mm_set1_epi16((short)0x8000);
  l = _mm_load_si128((const __m128i *)(left + 16));
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}